

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ngx_http_request.c
# Opt level: O0

ngx_int_t ngx_http_validate_host(ngx_str_t *host,ngx_pool_t *pool,ngx_uint_t alloc)

{
  byte bVar1;
  u_char *src;
  u_char *puVar2;
  int local_54;
  size_t sStack_50;
  anon_enum_32 state;
  size_t host_len;
  size_t dot_pos;
  size_t i;
  u_char ch;
  u_char *h;
  ngx_uint_t alloc_local;
  ngx_pool_t *pool_local;
  ngx_str_t *host_local;
  
  host_len = host->len;
  sStack_50 = host->len;
  src = host->data;
  local_54 = 0;
  h = (u_char *)alloc;
  for (dot_pos = 0; dot_pos < host->len; dot_pos = dot_pos + 1) {
    bVar1 = src[dot_pos];
    if (bVar1 == 0) {
      return -5;
    }
    if (bVar1 == 0x2e) {
      if (host_len == dot_pos - 1) {
        return -5;
      }
      host_len = dot_pos;
    }
    else if (bVar1 == 0x3a) {
      if (local_54 == 0) {
        sStack_50 = dot_pos;
        local_54 = 2;
      }
    }
    else if (bVar1 == 0x5b) {
      if (dot_pos == 0) {
        local_54 = 1;
      }
    }
    else if (bVar1 == 0x5d) {
      if (local_54 == 1) {
        sStack_50 = dot_pos + 1;
        local_54 = 2;
      }
    }
    else {
      if (bVar1 == 0x2f) {
        return -5;
      }
      if ((0x40 < bVar1) && (bVar1 < 0x5b)) {
        h = &DAT_00000001;
      }
    }
  }
  if (host_len == sStack_50 - 1) {
    sStack_50 = sStack_50 - 1;
  }
  if (sStack_50 == 0) {
    host_local = (ngx_str_t *)0xfffffffffffffffb;
  }
  else {
    if (h != (u_char *)0x0) {
      puVar2 = (u_char *)ngx_pnalloc(pool,sStack_50);
      host->data = puVar2;
      if (host->data == (u_char *)0x0) {
        return -1;
      }
      ngx_strlow(host->data,src,sStack_50);
    }
    host->len = sStack_50;
    host_local = (ngx_str_t *)0x0;
  }
  return (ngx_int_t)host_local;
}

Assistant:

static ngx_int_t
ngx_http_validate_host(ngx_str_t *host, ngx_pool_t *pool, ngx_uint_t alloc)
{
    u_char  *h, ch;
    size_t   i, dot_pos, host_len;

    enum {
        sw_usual = 0,
        sw_literal,
        sw_rest
    } state;

    dot_pos = host->len;
    host_len = host->len;

    h = host->data;

    state = sw_usual;

    for (i = 0; i < host->len; i++) {
        ch = h[i];

        switch (ch) {

        case '.':
            if (dot_pos == i - 1) {
                return NGX_DECLINED;
            }
            dot_pos = i;
            break;

        case ':':
            if (state == sw_usual) {
                host_len = i;
                state = sw_rest;
            }
            break;

        case '[':
            if (i == 0) {
                state = sw_literal;
            }
            break;

        case ']':
            if (state == sw_literal) {
                host_len = i + 1;
                state = sw_rest;
            }
            break;

        case '\0':
            return NGX_DECLINED;

        default:

            if (ngx_path_separator(ch)) {
                return NGX_DECLINED;
            }

            if (ch >= 'A' && ch <= 'Z') {
                alloc = 1;
            }

            break;
        }
    }

    if (dot_pos == host_len - 1) {
        host_len--;
    }

    if (host_len == 0) {
        return NGX_DECLINED;
    }

    if (alloc) {
        host->data = ngx_pnalloc(pool, host_len);
        if (host->data == NULL) {
            return NGX_ERROR;
        }

        ngx_strlow(host->data, h, host_len);
    }

    host->len = host_len;

    return NGX_OK;
}